

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O1

ssize_t tnt_buf_write(tnt_stream *s,char *buf,size_t size)

{
  long *plVar1;
  void *__dest;
  size_t sVar2;
  
  sVar2 = 0xffffffffffffffff;
  if (*(int *)((long)s->data + 0x38) != 1) {
    __dest = (void *)(**(code **)((long)s->data + 0x20))(s,size);
    if (__dest != (void *)0x0) {
      memcpy(__dest,buf,size);
      plVar1 = (long *)((long)s->data + 8);
      *plVar1 = *plVar1 + size;
      s->wrcnt = s->wrcnt + 1;
      sVar2 = size;
    }
  }
  return sVar2;
}

Assistant:

static ssize_t
tnt_buf_write(struct tnt_stream *s, const char *buf, size_t size) {
	if (TNT_SBUF_CAST(s)->as == 1) return -1;
	char *p = TNT_SBUF_CAST(s)->resize(s, size);
	if (p == NULL)
		return -1;
	memcpy(p, buf, size);
	TNT_SBUF_CAST(s)->size += size;
	s->wrcnt++;
	return size;
}